

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  ImGuiListClipperData *pIVar1;
  int iVar2;
  long *plVar3;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  plVar3 = (long *)this->TempData;
  if (plVar3 != (long *)0x0) {
    if (((uint)this->ItemsCount < 0x7fffffff) && (-1 < this->DisplayStart)) {
      ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
    }
    if ((ImGuiListClipper *)*plVar3 != this) {
      __assert_fail("data->ListClipper == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0xa47,"void ImGuiListClipper::End()");
    }
    *(int *)((long)plVar3 + 0xc) = (int)plVar3[3];
    iVar2 = pIVar4->ClipperTempDataStacked;
    pIVar4->ClipperTempDataStacked = iVar2 + -1;
    if (1 < iVar2) {
      if ((pIVar4->ClipperTempData).Size <= (int)(iVar2 - 2U)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,
                      "T &ImVector<ImGuiListClipperData>::operator[](int) [T = ImGuiListClipperData]"
                     );
      }
      pIVar1 = (pIVar4->ClipperTempData).Data + (iVar2 - 2U);
      pIVar1->ListClipper->TempData = pIVar1;
    }
    this->TempData = (void *)0x0;
  }
  this->ItemsCount = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}